

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

png_fixed_point png_get_fixed_point(png_structrp png_ptr,png_const_bytep buf)

{
  png_uint_32 uval;
  png_const_bytep buf_local;
  png_structrp png_ptr_local;
  
  png_ptr_local._4_4_ =
       (uint)*buf * 0x1000000 + (uint)buf[1] * 0x10000 + (uint)buf[2] * 0x100 + (uint)buf[3];
  if (0x7fffffff < png_ptr_local._4_4_) {
    if (png_ptr != (png_structrp)0x0) {
      png_warning(png_ptr,"PNG fixed point integer out of range");
    }
    png_ptr_local._4_4_ = 0xffffffff;
  }
  return png_ptr_local._4_4_;
}

Assistant:

static png_fixed_point /* PRIVATE */
png_get_fixed_point(png_structrp png_ptr, png_const_bytep buf)
{
   png_uint_32 uval = png_get_uint_32(buf);

   if (uval <= PNG_UINT_31_MAX)
      return (png_fixed_point)uval; /* known to be in range */

   /* The caller can turn off the warning by passing NULL. */
   if (png_ptr != NULL)
      png_warning(png_ptr, "PNG fixed point integer out of range");

   return PNG_FIXED_ERROR;
}